

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_msg.h
# Opt level: O0

void __thiscall nodecpp::platform::internal_msg::InternalMsg::implReleaseAllPages(InternalMsg *this)

{
  IndexPageHeader *pIVar1;
  PagePointer *pPVar2;
  bool bVar3;
  PagePointer local_68;
  PagePtrWrapper local_60;
  PagePointer page;
  ulong local_50;
  size_t j;
  anon_class_8_1_8991fb9c local_40;
  anon_class_8_1_8991fb9c local_38 [3];
  PagePointer local_20;
  ulong local_18;
  size_t i;
  InternalMsg *this_local;
  
  local_18 = 0;
  i = (size_t)this;
  while( true ) {
    bVar3 = false;
    if (local_18 < 4) {
      bVar3 = local_18 < this->pageCnt;
    }
    if (!bVar3) break;
    local_20.ptr = (this->firstHeader).firstPages[local_18].ptr;
    implReleasePageWrapper(this,&local_20);
    PagePtrWrapper::~PagePtrWrapper(&local_20);
    local_18 = local_18 + 1;
  }
  this->pageCnt = this->pageCnt - local_18;
  if (this->pageCnt != 0) {
    local_38[0].this = this;
    assert::
    nodecpp_assert<0ul,(nodecpp::assert::AssertLevel)2,nodecpp::platform::internal_msg::InternalMsg::implReleaseAllPages()::_lambda()_1_>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/node-dot-cpp[P]nodecpp-foundation/include/internal_msg.h"
               ,0xa0,local_38,"firstHeader.next() != nullptr");
    while (pIVar1 = IndexPageHeader::next((IndexPageHeader *)this), pIVar1 != (IndexPageHeader *)0x0
          ) {
      local_40.this = this;
      assert::
      nodecpp_assert<0ul,(nodecpp::assert::AssertLevel)2,nodecpp::platform::internal_msg::InternalMsg::implReleaseAllPages()::_lambda()_2_>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/node-dot-cpp[P]nodecpp-foundation/include/internal_msg.h"
                 ,0xa3,&local_40,
                 "pageCnt > localStorageSize || firstHeader.next()->next() == nullptr");
      j = (size_t)this;
      assert::
      nodecpp_assert<0ul,(nodecpp::assert::AssertLevel)2,nodecpp::platform::internal_msg::InternalMsg::implReleaseAllPages()::_lambda()_3_>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/node-dot-cpp[P]nodecpp-foundation/include/internal_msg.h"
                 ,0xa4,(anon_class_8_1_8991fb9c *)&j,"firstHeader.next()->usedCnt <= pageCnt");
      for (local_50 = 0; pIVar1 = IndexPageHeader::next((IndexPageHeader *)this),
          local_50 < pIVar1->usedCnt; local_50 = local_50 + 1) {
        pIVar1 = IndexPageHeader::next((IndexPageHeader *)this);
        pPVar2 = IndexPageHeader::pages(pIVar1);
        page.ptr = pPVar2[local_50].ptr;
        implReleasePageWrapper(this,&page);
        PagePtrWrapper::~PagePtrWrapper(&page);
      }
      pIVar1 = IndexPageHeader::next((IndexPageHeader *)this);
      this->pageCnt = this->pageCnt - pIVar1->usedCnt;
      local_60.ptr = (this->firstHeader).super_IndexPageHeader.next_.ptr;
      pIVar1 = IndexPageHeader::next((IndexPageHeader *)this);
      (this->firstHeader).super_IndexPageHeader.next_.ptr = (pIVar1->next_).ptr;
      local_68.ptr = local_60.ptr;
      implReleasePageWrapper(this,&local_68);
      PagePtrWrapper::~PagePtrWrapper(&local_68);
      PagePtrWrapper::~PagePtrWrapper(&local_60);
    }
  }
  return;
}

Assistant:

void implReleaseAllPages()
		{
			size_t i;
			for ( i=0; i<localStorageSize && i<pageCnt; ++i )
				implReleasePageWrapper( firstHeader.firstPages[i] );
			pageCnt -= i;
			if ( pageCnt )
			{
				NODECPP_ASSERT( nodecpp::foundation::module_id, nodecpp::assert::AssertLevel::pedantic, firstHeader.next() != nullptr );
				while ( firstHeader.next() != nullptr )
				{
					NODECPP_ASSERT( nodecpp::foundation::module_id, nodecpp::assert::AssertLevel::pedantic, pageCnt > localStorageSize || firstHeader.next()->next() == nullptr );
					NODECPP_ASSERT( nodecpp::foundation::module_id, nodecpp::assert::AssertLevel::pedantic, firstHeader.next()->usedCnt <= pageCnt );
					for ( size_t j=0; j<firstHeader.next()->usedCnt; ++j )
						implReleasePageWrapper( firstHeader.next()->pages()[j] );
					pageCnt -= firstHeader.next()->usedCnt;
					PagePointer page = firstHeader.next_;
					firstHeader.next_ = firstHeader.next()->next_;
					implReleasePageWrapper( page );
				}
			}
		}